

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  bool bVar1;
  Descriptor *type;
  Message *this_00;
  MessageLite *this_01;
  undefined8 *puVar2;
  Nullable<const_char_*> failure_msg;
  UnknownFieldSet *this_02;
  LogMessage *this_03;
  string_view value;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  string_view input;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  AggregateOptionFinder finder;
  string serial;
  Parser parser;
  AggregateErrorCollector collector;
  undefined1 local_d0 [8];
  Finder local_c8;
  DescriptorBuilder *local_c0;
  string local_b8;
  Type local_94;
  LogMessageFatal local_90;
  Parser local_80;
  AggregateErrorCollector local_50;
  
  local_d0 = (undefined1  [8])option_field;
  if ((undefined1  [80])
      ((undefined1  [80])this->uninterpreted_option_->field_0 & (undefined1  [80])0x4) ==
      (undefined1  [80])0x0) {
    local_80.error_collector_ = (ErrorCollector *)local_d0;
    make_error.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__0,std::__cxx11::string>
    ;
    make_error.ptr_.obj = &local_80;
    bVar1 = AddValueError(this,make_error);
  }
  else {
    type = FieldDescriptor::message_type(option_field);
    this_00 = DynamicMessageFactory::GetPrototype(&this->dynamic_factory_,type);
    this_01 = &Message::New(this_00)->super_MessageLite;
    if (this_01 == (MessageLite *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                 ,0x27e0,"dynamic.get() != nullptr");
      this_03 = absl::lts_20250127::log_internal::LogMessage::operator<<
                          ((LogMessage *)&local_50,(char (*) [33])"Could not create an instance of "
                          );
      FieldDescriptor::DebugString_abi_cxx11_((string *)&local_80,(FieldDescriptor *)local_d0);
      absl::lts_20250127::log_internal::LogMessage::operator<<(this_03,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_50);
    }
    local_50.error_._M_dataplus._M_p = (pointer)&local_50.error_.field_2;
    local_50.super_ErrorCollector._vptr_ErrorCollector =
         (_func_int **)&PTR__AggregateErrorCollector_00544a48;
    local_50.error_._M_string_length = 0;
    local_50.error_.field_2._M_local_buf[0] = '\0';
    local_c8._vptr_Finder = (_func_int **)&PTR__Finder_00544d10;
    local_c0 = this->builder_;
    TextFormat::Parser::Parser(&local_80);
    local_80.finder_ = &local_c8;
    puVar2 = (undefined8 *)
             ((ulong)(this->uninterpreted_option_->field_0)._impl_.aggregate_value_.tagged_ptr_.ptr_
             & 0xfffffffffffffffc);
    input._M_str = (char *)*puVar2;
    input._M_len = puVar2[1];
    local_80.error_collector_ = &local_50.super_ErrorCollector;
    bVar1 = TextFormat::Parser::ParseFromString(&local_80,input,(Message *)this_01);
    if (bVar1) {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      MessageLite::SerializeToString(this_01,&local_b8);
      if (*(uint8_t *)((long)local_d0 + 2) == 0xb) {
        value._M_str = local_b8._M_dataplus._M_p;
        value._M_len = local_b8._M_string_length;
        UnknownFieldSet::AddLengthDelimited(unknown_fields,*(int *)((long)local_d0 + 4),value);
      }
      else {
        local_94 = TYPE_GROUP;
        local_90.super_LogMessage.errno_saver_.saved_errno_ = (uint)*(uint8_t *)((long)local_d0 + 2)
        ;
        failure_msg = absl::lts_20250127::log_internal::
                      Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::Type,google::protobuf::internal::FieldDescriptorLite::Type>
                                ((Type *)&local_90,&local_94,
                                 "option_field->type() == FieldDescriptor::TYPE_GROUP");
        if (failure_msg != (Nullable<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_90,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                     ,0x27f6,failure_msg);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_90);
        }
        this_02 = UnknownFieldSet::AddGroup(unknown_fields,*(int *)((long)local_d0 + 4));
        UnknownFieldSet::ParseFromArray
                  (this_02,local_b8._M_dataplus._M_p,(int)local_b8._M_string_length);
      }
      std::__cxx11::string::~string((string *)&local_b8);
    }
    else {
      local_b8._M_dataplus._M_p = local_d0;
      make_error_00.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__1,std::__cxx11::string>
      ;
      make_error_00.ptr_.obj = &local_b8;
      local_b8._M_string_length = (size_type)&local_50;
      AddValueError(this,make_error_00);
    }
    TextFormat::Parser::~Parser(&local_80);
    TextFormat::Finder::~Finder(&local_c8);
    anon_unknown_24::AggregateErrorCollector::~AggregateErrorCollector(&local_50);
    (*this_01->_vptr_MessageLite[1])(this_01);
  }
  return bVar1;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetAggregateOption(
    const FieldDescriptor* option_field, UnknownFieldSet* unknown_fields) {
  if (!uninterpreted_option_->has_aggregate_value()) {
    return AddValueError([&] {
      return absl::StrCat("Option \"", option_field->full_name(),
                          "\" is a message. "
                          "To set the entire message, use syntax like \"",
                          option_field->name(),
                          " = { <proto text format> }\". "
                          "To set fields within it, use syntax like \"",
                          option_field->name(), ".foo = value\".");
    });
  }

  const Descriptor* type = option_field->message_type();
  std::unique_ptr<Message> dynamic(dynamic_factory_.GetPrototype(type)->New());
  ABSL_CHECK(dynamic.get() != nullptr)
      << "Could not create an instance of " << option_field->DebugString();

  AggregateErrorCollector collector;
  AggregateOptionFinder finder;
  finder.builder_ = builder_;
  TextFormat::Parser parser;
  parser.RecordErrorsTo(&collector);
  parser.SetFinder(&finder);
  if (!parser.ParseFromString(uninterpreted_option_->aggregate_value(),
                              dynamic.get())) {
    AddValueError([&] {
      return absl::StrCat("Error while parsing option value for \"",
                          option_field->name(), "\": ", collector.error_);
    });
    return false;
  } else {
    std::string serial;
    dynamic->SerializeToString(&serial);  // Never fails
    if (option_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      unknown_fields->AddLengthDelimited(option_field->number(), serial);
    } else {
      ABSL_CHECK_EQ(option_field->type(), FieldDescriptor::TYPE_GROUP);
      UnknownFieldSet* group = unknown_fields->AddGroup(option_field->number());
      group->ParseFromString(serial);
    }
    return true;
  }
}